

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall AsyncTCPClient::onRequestComplete(AsyncTCPClient *this,shared_ptr<Session> *session)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  element_type *peVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  iterator __position;
  error_code ec;
  unique_lock<std::mutex> lock;
  error_code ignored_ec;
  error_code local_58;
  unique_lock<std::mutex> local_48;
  undefined4 local_38;
  undefined1 local_34;
  undefined8 *local_30;
  
  local_38 = 0;
  local_34 = 0;
  local_30 = &boost::system::detail::cat_holder<void>::system_category_instance;
  peVar3 = (session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::shutdown
            ((peVar3->m_sock).
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .impl_.service_,(int)peVar3 + 8,2);
  local_48._M_device = &this->m_active_sessions_guard;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  uVar2 = ((session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_id;
  p_Var1 = &(this->m_active_sessions)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->m_active_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)uVar2]
      ) {
    if ((int)uVar2 <= (int)p_Var4[1]._M_color) {
      p_Var5 = p_Var4;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (__position._M_node = p_Var5, (int)uVar2 < (int)p_Var5[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    std::
    _Rb_tree<int,std::pair<int_const,std::shared_ptr<Session>>,std::_Select1st<std::pair<int_const,std::shared_ptr<Session>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<Session>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::shared_ptr<Session>>,std::_Select1st<std::pair<int_const,std::shared_ptr<Session>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<Session>>>>
                        *)&this->m_active_sessions,__position);
  }
  std::unique_lock<std::mutex>::unlock(&local_48);
  peVar3 = (session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((peVar3->m_ec).val_ == 0) && (peVar3->m_was_cancelled == true)) {
    local_58.val_ = 0x7d;
    local_58.failed_ = true;
    local_58._5_3_ = 0;
    local_58.cat_ =
         (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  }
  else {
    local_58.val_ = (peVar3->m_ec).val_;
    local_58.failed_ = (peVar3->m_ec).failed_;
    local_58._5_3_ = *(undefined3 *)&(peVar3->m_ec).field_0x5;
    local_58.cat_ = (peVar3->m_ec).cat_;
  }
  (*peVar3->m_callback)(peVar3->m_id,&peVar3->m_response,&local_58);
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void onRequestComplete(std::shared_ptr<Session> session)
    {
        // Shutting down the connection. This method may
        // fail in case socket is not connected. We don�t care
        // about the error code if this function fails.
        boost::system::error_code ignored_ec;

        session->m_sock.shutdown( asio::ip::tcp::socket::shutdown_both, ignored_ec);

        // Remove session form the map of active sessions.
        std::unique_lock<std::mutex>
            lock(m_active_sessions_guard);

        auto it = m_active_sessions.find(session->m_id);
        if (it != m_active_sessions.end())
            m_active_sessions.erase(it);

        lock.unlock();

        boost::system::error_code ec;

        if (session->m_ec.value() == 0 && session->m_was_cancelled)
            ec = asio::error::operation_aborted;
        else
            ec = session->m_ec;

        // Call the callback provided by the user.
        session->m_callback(session->m_id,
                            session->m_response, ec);
    }